

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printAddrMode2Operand(MCInst *MI,uint Op,SStream *O)

{
  _Bool _Var1;
  MCOperand *op;
  MCOperand *MO1;
  SStream *O_local;
  uint Op_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,Op);
  _Var1 = MCOperand_isReg(op);
  if (_Var1) {
    printAM2PreOrOffsetIndexOp(MI,Op,O);
  }
  else {
    printOperand(MI,Op,O);
  }
  return;
}

Assistant:

static void printAddrMode2Operand(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);

	if (!MCOperand_isReg(MO1)) {   // FIXME: This is for CP entries, but isn't right.
		printOperand(MI, Op, O);
		return;
	}

	printAM2PreOrOffsetIndexOp(MI, Op, O);
}